

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O3

int new_dir(X509_LOOKUP *lu)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)OPENSSL_malloc(8);
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = 0;
    lu->method_data = puVar1;
  }
  return (uint)(puVar1 != (undefined8 *)0x0);
}

Assistant:

static int new_dir(X509_LOOKUP *lu) {
  BY_DIR *a;

  if ((a = (BY_DIR *)OPENSSL_malloc(sizeof(BY_DIR))) == NULL) {
    return 0;
  }
  a->dirs = NULL;
  lu->method_data = a;
  return 1;
}